

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pawns.cpp
# Opt level: O1

void __thiscall pawn_table::pawn_table(pawn_table *this,pawn_table *o)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  (this->entries).super___shared_ptr<pawn_entry[],_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->entries).super___shared_ptr<pawn_entry[],_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->sz_mb = 0;
  this->count = 0;
  peVar2 = (element_type *)operator_new__(0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<pawn_entry*,std::__sp_array_delete,std::allocator<void>,void>(a_Stack_20,peVar2);
  _Var1._M_pi = a_Stack_20[0]._M_pi;
  a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->entries).super___shared_ptr<pawn_entry[],_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi;
  (this->entries).super___shared_ptr<pawn_entry[],_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  (this->entries).super___shared_ptr<pawn_entry[],_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (a_Stack_20[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_20[0]._M_pi);
  }
  memcpy((this->entries).super___shared_ptr<pawn_entry[],_(__gnu_cxx::_Lock_policy)2>._M_ptr,
         (o->entries).super___shared_ptr<pawn_entry[],_(__gnu_cxx::_Lock_policy)2>._M_ptr,
         this->count * 0x128);
  this->sz_mb = o->sz_mb;
  this->count = o->count;
  return;
}

Assistant:

pawn_table::pawn_table(const pawn_table& o) {
	entries = std::shared_ptr<pawn_entry[]>(new pawn_entry[count]());
	std::memcpy(entries.get(), o.entries.get(), count * sizeof(pawn_entry));
	sz_mb = o.sz_mb;
	count = o.count;
}